

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::StreamingReporterBase::~StreamingReporterBase(StreamingReporterBase *this)

{
  Ptr<Catch::ThreadedSectionInfo> *in_RDI;
  vector<Catch::Ptr<Catch::ThreadedSectionInfo>,_std::allocator<Catch::Ptr<Catch::ThreadedSectionInfo>_>_>
  *unaff_retaddr;
  
  in_RDI->m_p = (ThreadedSectionInfo *)&PTR__StreamingReporterBase_0021ee50;
  std::
  vector<Catch::Ptr<Catch::ThreadedSectionInfo>,_std::allocator<Catch::Ptr<Catch::ThreadedSectionInfo>_>_>
  ::~vector(unaff_retaddr);
  Ptr<Catch::ThreadedSectionInfo>::~Ptr(in_RDI);
  Option<Catch::TestCaseInfo>::~Option((Option<Catch::TestCaseInfo> *)0x1a149c);
  Option<Catch::GroupInfo>::~Option((Option<Catch::GroupInfo> *)0x1a14aa);
  Option<Catch::TestRunInfo>::~Option((Option<Catch::TestRunInfo> *)0x1a14b8);
  Ptr<Catch::IConfig>::~Ptr((Ptr<Catch::IConfig> *)in_RDI);
  SharedImpl<Catch::IStreamingReporter>::~SharedImpl
            ((SharedImpl<Catch::IStreamingReporter> *)0x1a14d0);
  return;
}

Assistant:

StreamingReporterBase::~StreamingReporterBase() {}